

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O1

void test_cpp_wrapper_setup_all(planck_unit_test_t *tc)

{
  ion_err_t iVar1;
  Dictionary<int,_int> *pDVar2;
  
  pDVar2 = (Dictionary<int,_int> *)operator_new(0x80);
  BppTree<int,_int>::BppTree((BppTree<int,_int> *)pDVar2,0,key_type_numeric_signed,4,4);
  cpp_wrapper_setup(tc,pDVar2,ion_fill_none);
  iVar1 = dictionary_delete_dictionary(&pDVar2->dict);
  (pDVar2->last_status).error = iVar1;
  operator_delete(pDVar2);
  pDVar2 = (Dictionary<int,_int> *)operator_new(0x80);
  SkipList<int,_int>::SkipList((SkipList<int,_int> *)pDVar2,0,key_type_numeric_signed,4,4,7);
  cpp_wrapper_setup(tc,pDVar2,ion_fill_none);
  iVar1 = dictionary_delete_dictionary(&pDVar2->dict);
  (pDVar2->last_status).error = iVar1;
  operator_delete(pDVar2);
  pDVar2 = (Dictionary<int,_int> *)operator_new(0x80);
  FlatFile<int,_int>::FlatFile((FlatFile<int,_int> *)pDVar2,0,key_type_numeric_signed,4,4,0x1e);
  cpp_wrapper_setup(tc,pDVar2,ion_fill_none);
  iVar1 = dictionary_delete_dictionary(&pDVar2->dict);
  (pDVar2->last_status).error = iVar1;
  operator_delete(pDVar2);
  pDVar2 = (Dictionary<int,_int> *)operator_new(0x80);
  OpenAddressHash<int,_int>::OpenAddressHash
            ((OpenAddressHash<int,_int> *)pDVar2,0,key_type_numeric_signed,4,4,0x32);
  cpp_wrapper_setup(tc,pDVar2,ion_fill_none);
  iVar1 = dictionary_delete_dictionary(&pDVar2->dict);
  (pDVar2->last_status).error = iVar1;
  operator_delete(pDVar2);
  pDVar2 = (Dictionary<int,_int> *)operator_new(0x80);
  OpenAddressFileHash<int,_int>::OpenAddressFileHash
            ((OpenAddressFileHash<int,_int> *)pDVar2,0,key_type_numeric_signed,4,4,0x32);
  cpp_wrapper_setup(tc,pDVar2,ion_fill_none);
  iVar1 = dictionary_delete_dictionary(&pDVar2->dict);
  (pDVar2->last_status).error = iVar1;
  operator_delete(pDVar2);
  pDVar2 = (Dictionary<int,_int> *)operator_new(0x80);
  LinearHash<int,_int>::LinearHash
            ((LinearHash<int,_int> *)pDVar2,0,key_type_numeric_signed,4,4,0x32);
  cpp_wrapper_setup(tc,pDVar2,ion_fill_none);
  iVar1 = dictionary_delete_dictionary(&pDVar2->dict);
  (pDVar2->last_status).error = iVar1;
  operator_delete(pDVar2);
  return;
}

Assistant:

void
test_cpp_wrapper_setup_all(
	planck_unit_test_t *tc
) {
	Dictionary<int, int> *dict;

	dict = new BppTree<int, int>(0, key_type_numeric_signed, sizeof(int), sizeof(int));
	test_cpp_wrapper_setup(tc, dict);
	delete dict;

	dict = new SkipList<int, int>(0, key_type_numeric_signed, sizeof(int), sizeof(int), 7);
	test_cpp_wrapper_setup(tc, dict);
	delete dict;

	dict = new FlatFile<int, int>(0, key_type_numeric_signed, sizeof(int), sizeof(int), 30);
	test_cpp_wrapper_setup(tc, dict);
	delete dict;

	dict = new OpenAddressHash<int, int>(0, key_type_numeric_signed, sizeof(int), sizeof(int), 50);
	test_cpp_wrapper_setup(tc, dict);
	delete dict;

	dict = new OpenAddressFileHash<int, int>(0, key_type_numeric_signed, sizeof(int), sizeof(int), 50);
	test_cpp_wrapper_setup(tc, dict);
	delete dict;

	dict = new LinearHash<int, int>(0, key_type_numeric_signed, sizeof(int), sizeof(int), 50);
	test_cpp_wrapper_setup(tc, dict);
	delete dict;
}